

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_bmp_append_doc(fdb_kvs_handle *handle)

{
  long lVar1;
  uint64_t bmp_size;
  size_t __nmemb;
  void *pvVar2;
  uint64_t uVar3;
  __pointer_type puVar4;
  size_t sVar5;
  bid_t bVar6;
  long in_RDI;
  uint64_t sb_bmp_size;
  superblock *sb;
  char doc_key [64];
  uint64_t num_docs;
  size_t i;
  undefined4 in_stack_ffffffffffffff68;
  memory_order in_stack_ffffffffffffff6c;
  atomic<unsigned_long> *in_stack_ffffffffffffff70;
  docio_handle *handle_00;
  char local_58 [40];
  void *in_stack_ffffffffffffffd0;
  err_log_callback *in_stack_ffffffffffffffd8;
  filemgr *in_stack_ffffffffffffffe0;
  ulong local_10;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x48) + 0x198);
  if (*(long *)(lVar1 + 0x60) != 0) {
    for (local_10 = 0; local_10 < *(ulong *)(lVar1 + 0x70); local_10 = local_10 + 1) {
      _fdb_get_docsize(*(docio_length *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38));
      filemgr_mark_stale(in_stack_ffffffffffffffe0,(bid_t)in_stack_ffffffffffffffd8,
                         (size_t)in_stack_ffffffffffffffd0);
    }
    free(*(void **)(lVar1 + 0x60));
    free(*(void **)(lVar1 + 0x68));
    *(undefined8 *)(lVar1 + 0x60) = 0;
    *(undefined8 *)(lVar1 + 0x68) = 0;
  }
  bmp_size = atomic_get_uint64_t(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  __nmemb = _bmp_size_to_num_docs(bmp_size);
  *(size_t *)(lVar1 + 0x70) = __nmemb;
  if (__nmemb != 0) {
    pvVar2 = calloc(__nmemb,8);
    *(void **)(lVar1 + 0x60) = pvVar2;
    pvVar2 = calloc(__nmemb,0x38);
    *(void **)(lVar1 + 0x68) = pvVar2;
  }
  for (local_10 = 0; local_10 < __nmemb; local_10 = local_10 + 1) {
    memset((void *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38),0,0x38);
    handle_00 = (docio_handle *)local_58;
    uVar3 = atomic_get_uint64_t((atomic<unsigned_long> *)handle_00,in_stack_ffffffffffffff6c);
    sprintf((char *)handle_00,"bitmap_%lu_%d",uVar3,local_10 & 0xffffffff);
    *(char **)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 0x18) = local_58;
    *(undefined8 *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 0x28) = 0;
    puVar4 = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x181ec1);
    *(__pointer_type *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 0x30) =
         puVar4 + local_10 * 0x100000;
    sVar5 = strlen(local_58);
    *(short *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38) = (short)sVar5 + 1;
    *(undefined2 *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 2) = 0;
    if (local_10 == __nmemb - 1) {
      *(uint *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 4) = (uint)(bmp_size >> 3) & 0xfffff;
    }
    else {
      *(undefined4 *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 4) = 0x100000;
    }
    *(undefined8 *)(*(long *)(lVar1 + 0x68) + local_10 * 0x38 + 0x20) = 0;
    bVar6 = docio_append_doc_system
                      (handle_00,
                       (docio_object *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                      );
    *(bid_t *)(*(long *)(lVar1 + 0x60) + local_10 * 8) = bVar6;
  }
  return;
}

Assistant:

void sb_bmp_append_doc(fdb_kvs_handle *handle)
{
    // == write bitmap into system docs ==
    // calculate # docs (1MB by default)
    // (1MB bitmap covers 32GB DB file)
    size_t i;
    uint64_t num_docs;
    char doc_key[64];
    struct superblock *sb = handle->file->sb;

    // mark stale if previous doc offset exists
    if (sb->bmp_doc_offset) {
        for (i=0; i<sb->num_bmp_docs; ++i) {
            filemgr_mark_stale(handle->file, sb->bmp_doc_offset[i],
                _fdb_get_docsize(sb->bmp_docs[i].length));
        }

        free(sb->bmp_doc_offset);
        free(sb->bmp_docs);
        sb->bmp_doc_offset = NULL;
        sb->bmp_docs = NULL;
    }

    uint64_t sb_bmp_size = atomic_get_uint64_t(&sb->bmp_size);
    sb->num_bmp_docs = num_docs = _bmp_size_to_num_docs(sb_bmp_size);
    if (num_docs) {
        sb->bmp_doc_offset = (bid_t*)calloc(num_docs, sizeof(bid_t));
        sb->bmp_docs = (struct docio_object*)
                       calloc(num_docs, sizeof(struct docio_object));
    }

    // bitmap doc offsets
    for (i=0; i<num_docs; ++i) {
        // append a system doc for bitmap chunk
        memset(&sb->bmp_docs[i], 0x0, sizeof(struct docio_object));
        sprintf(doc_key, "bitmap_%" _F64 "_%d",
                atomic_get_uint64_t(&sb->bmp_revnum), (int)i);
        sb->bmp_docs[i].key = (void*)doc_key;
        sb->bmp_docs[i].meta = NULL;
        sb->bmp_docs[i].body = sb->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

        sb->bmp_docs[i].length.keylen = strlen(doc_key)+1;
        sb->bmp_docs[i].length.metalen = 0;
        if (i == num_docs - 1) {
            // the last doc
            sb->bmp_docs[i].length.bodylen =
                (sb_bmp_size / 8) % SB_MAX_BITMAP_DOC_SIZE;
        } else {
            // otherwise: 1MB
            sb->bmp_docs[i].length.bodylen = SB_MAX_BITMAP_DOC_SIZE;
        }
        sb->bmp_docs[i].seqnum = 0;
        sb->bmp_doc_offset[i] =
            docio_append_doc_system(handle->dhandle, &sb->bmp_docs[i]);
    }
}